

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QFileSystemEntry *
QFileSystemEngine::canonicalName(QFileSystemEntry *entry,QFileSystemMetaData *data)

{
  bool bVar1;
  MetaDataFlags mask;
  char *pcVar2;
  int *piVar3;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_RDX;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  char *resolved_name;
  char stack_result [4097];
  QFileSystemEntry *in_stack_ffffffffffffef38;
  QFileSystemEntry *this;
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  char local_1018 [4112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QFileSystemEntry::isEmpty(in_RDI);
  if (bVar1) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    QFileSystemEntry::QFileSystemEntry(in_RDI,in_stack_ffffffffffffef38);
  }
  else {
    bVar1 = qIsFilenameBroken(in_RDI);
    if (bVar1) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      QFileSystemEntry::QFileSystemEntry(in_RDI,in_stack_ffffffffffffef38);
    }
    else {
      memset(local_1018,0xaa,0x1001);
      QFileSystemEntry::nativeFilePath(this);
      pcVar2 = QByteArray::constData((QByteArray *)0x210ad1);
      pcVar2 = realpath(pcVar2,local_1018);
      QByteArray::~QByteArray((QByteArray *)0x210af0);
      if (pcVar2 == (char *)0x0) {
        piVar3 = __errno_location();
        if ((*piVar3 == 2) || (piVar3 = __errno_location(), *piVar3 == 0x14)) {
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDX,ExistsAttribute);
          mask = operator~((enum_type)((ulong)in_RDI >> 0x20));
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator&=
                    (in_RDX + 1,
                     (QFlags<QFileSystemMetaData::MetaDataFlag>)
                     mask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                     super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
          QFileSystemEntry::QFileSystemEntry(in_RDI);
        }
        else {
          QFileSystemEntry::QFileSystemEntry(in_RDI,in_stack_ffffffffffffef38);
        }
      }
      else {
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDX,ExistsAttribute);
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RDX + 1,ExistsAttribute);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
                   (char *)this,(qsizetype)in_RDI);
        QFileSystemEntry::QFileSystemEntry
                  (this,(NativePath *)in_RDI,SUB41((uint)in_stack_ffffffffffffef54 >> 0x18,0));
        QByteArray::~QByteArray((QByteArray *)0x210b49);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QFileSystemEntry QFileSystemEngine::canonicalName(const QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(entry, entry);
    char *resolved_name = nullptr;

#ifdef PATH_MAX
    // use the stack to avoid the overhead of memory allocation
    char stack_result[PATH_MAX + 1];
#else
    // system with unlimited file paths -> must use heap
    std::nullptr_t stack_result = nullptr;
    auto freer = qScopeGuard([&] { free(resolved_name); });
#endif

# if defined(Q_OS_DARWIN) || defined(Q_OS_ANDROID)
    // On some Android and macOS versions, realpath() will return a path even if
    // it does not exist. To work around this, we check existence in advance.
    if (!data.hasFlags(QFileSystemMetaData::ExistsAttribute))
        fillMetaData(entry, data, QFileSystemMetaData::ExistsAttribute);

    if (!data.exists())
        errno = ENOENT;
    else
        resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# else
    resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# endif
    if (resolved_name) {
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        return QFileSystemEntry(resolved_name, QFileSystemEntry::FromNativePath{});
    } else if (errno == ENOENT || errno == ENOTDIR) { // file doesn't exist
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags &= ~(QFileSystemMetaData::ExistsAttribute);
        return QFileSystemEntry();
    }
    return entry;
}